

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findOrCreateNodeOfSize(MemoryAccountant *this,size_t size)

{
  ulong uVar1;
  int iVar2;
  MemoryAccountantAllocationNode *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryAccountantAllocationNode *pMVar5;
  MemoryAccountantAllocationNode *pMVar4;
  undefined4 extraout_var_01;
  
  if (this->useCacheSizes_ != true) {
    pMVar3 = this->head_;
    if (pMVar3 == (MemoryAccountantAllocationNode *)0x0) {
      iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                        (this->allocator_,0x30,
                         "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O3/_deps/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
                         ,0x199);
      pMVar3 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var_00,iVar2);
      pMVar3->size_ = size;
      pMVar3->allocations_ = 0;
      pMVar3->deallocations_ = 0;
      pMVar3->maxAllocations_ = 0;
      pMVar3->currentAllocations_ = 0;
      pMVar3->next_ = (MemoryAccountantAllocationNode *)0x0;
      this->head_ = pMVar3;
    }
    else {
      pMVar4 = pMVar3;
      if (size < pMVar3->size_) {
        iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                          (this->allocator_,0x30,
                           "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O3/_deps/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
                           ,0x199);
        pMVar4 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var,iVar2);
        pMVar4->size_ = size;
        pMVar4->allocations_ = 0;
        pMVar4->deallocations_ = 0;
        pMVar4->maxAllocations_ = 0;
        pMVar4->currentAllocations_ = 0;
        pMVar4->next_ = pMVar3;
        this->head_ = pMVar4;
      }
      uVar1 = pMVar4->size_;
      while (pMVar3 = pMVar4, uVar1 != size) {
        pMVar4 = pMVar3->next_;
        if ((pMVar4 == (MemoryAccountantAllocationNode *)0x0) ||
           (uVar1 = pMVar4->size_, size < pMVar4->size_)) {
          iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                            (this->allocator_,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O3/_deps/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
                             ,0x199);
          pMVar5 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var_01,iVar2);
          pMVar5->size_ = size;
          pMVar5->allocations_ = 0;
          pMVar5->deallocations_ = 0;
          pMVar5->maxAllocations_ = 0;
          pMVar5->currentAllocations_ = 0;
          pMVar5->next_ = pMVar4;
          pMVar3->next_ = pMVar5;
          pMVar4 = pMVar5;
          uVar1 = size;
        }
      }
    }
    return pMVar3;
  }
  pMVar3 = findNodeOfSize(this,size);
  return pMVar3;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findOrCreateNodeOfSize(size_t size)
{
    if (useCacheSizes_)
      return findNodeOfSize(size);

    if (head_ && head_->size_ > size)
        head_ = createNewAccountantAllocationNode(size, head_);

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
        if (node->size_ == size)
            return node;
        if (node->next_ == NULLPTR || node->next_->size_ > size)
            node->next_ = createNewAccountantAllocationNode(size, node->next_);
    }
    head_ = createNewAccountantAllocationNode(size, head_);
    return head_;
}